

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O3

bool __thiscall
basist::basisu_lowlevel_etc1s_transcoder::transcode_image
          (basisu_lowlevel_etc1s_transcoder *this,transcoder_texture_format target_format,
          void *pOutput_blocks,uint32_t output_blocks_buf_size_in_blocks_or_pixels,
          uint8_t *pCompressed_data,uint32_t compressed_data_length,uint32_t num_blocks_x,
          uint32_t num_blocks_y,uint32_t orig_width,uint32_t orig_height,uint32_t level_index,
          uint32_t rgb_offset,uint32_t rgb_length,uint32_t alpha_offset,uint32_t alpha_length,
          uint32_t decode_flags,bool basis_file_has_alpha_slices,bool is_video,
          uint32_t output_row_pitch_in_blocks_or_pixels,basisu_transcoder_state *pState,
          uint32_t output_rows_in_pixels)

{
  bool bVar1;
  uint32_t uVar2;
  block_format fmt;
  ulong uVar3;
  byte is_alpha_slice;
  uint32_t uVar4;
  uint8_t *pImage_data;
  uint8_t *pImage_data_00;
  uint32_t uVar5;
  uint uVar6;
  uint8_t *pImage_data_01;
  transcoder_texture_format fmt_00;
  bool transcode_alpha;
  vector<unsigned_int> temp_block_indices;
  
  if ((ulong)compressed_data_length < (ulong)rgb_offset + (ulong)rgb_length) {
    return false;
  }
  if (alpha_length == 0) {
    if (basis_file_has_alpha_slices) {
      __assert_fail("!basis_file_has_alpha_slices",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x21e7,
                    "bool basist::basisu_lowlevel_etc1s_transcoder::transcode_image(transcoder_texture_format, void *, uint32_t, const uint8_t *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool, bool, uint32_t, basisu_transcoder_state *, uint32_t)"
                   );
    }
  }
  else if ((ulong)compressed_data_length < (ulong)alpha_length + (ulong)alpha_offset) {
    return false;
  }
  if ((target_format & ~cTFETC2) == cTFPVRTC1_4_RGB) {
    uVar6 = num_blocks_x * 4 - 1;
    if ((num_blocks_x * 4 ^ uVar6) <= uVar6) {
      return false;
    }
    uVar6 = num_blocks_y * 4 - 1;
    if ((num_blocks_y * 4 ^ uVar6) <= uVar6) {
      return false;
    }
  }
  fmt_00 = basis_file_has_alpha_slices | cTFPVRTC1_4_RGB;
  if (target_format != cTFPVRTC1_4_RGBA) {
    fmt_00 = target_format;
  }
  uVar2 = basis_get_bytes_per_block_or_pixel(fmt_00);
  if (fmt_00 - cTFRGBA32 < 4) {
    uVar5 = output_row_pitch_in_blocks_or_pixels;
    if (output_row_pitch_in_blocks_or_pixels == 0) {
      uVar5 = orig_width;
    }
    uVar4 = output_rows_in_pixels;
    if (output_rows_in_pixels == 0) {
      uVar4 = orig_height;
    }
    if (output_blocks_buf_size_in_blocks_or_pixels < uVar4 * uVar5) {
      return false;
    }
  }
  else if (output_blocks_buf_size_in_blocks_or_pixels < num_blocks_y * num_blocks_x ||
           fmt_00 == cTFFXT1_RGB) {
    return false;
  }
  pImage_data = pCompressed_data + rgb_offset;
  is_alpha_slice = (byte)decode_flags >> 2 & basis_file_has_alpha_slices;
  pImage_data_01 = pCompressed_data + alpha_offset;
  uVar5 = rgb_length;
  pImage_data_00 = pImage_data;
  if (is_alpha_slice != 0) {
    uVar5 = alpha_length;
    pImage_data_00 = pImage_data_01;
  }
  switch(fmt_00) {
  case cTFETC1:
    fmt = cETC1;
    goto LAB_001297ac;
  case cTFETC2:
    if (uVar2 != 0x10) {
      __assert_fail("bytes_per_block_or_pixel == 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x2291,
                    "bool basist::basisu_lowlevel_etc1s_transcoder::transcode_image(transcoder_texture_format, void *, uint32_t, const uint8_t *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool, bool, uint32_t, basisu_transcoder_state *, uint32_t)"
                   );
    }
    if (basis_file_has_alpha_slices) {
      bVar1 = transcode_slice(this,pOutput_blocks,num_blocks_x,num_blocks_y,pImage_data_01,
                              alpha_length,cETC2_EAC_A8,0x10,false,is_video,true,level_index,
                              orig_width,orig_height,output_row_pitch_in_blocks_or_pixels,pState,
                              false,(void *)0x0,output_rows_in_pixels);
      if (!bVar1) {
        return false;
      }
    }
    else if (num_blocks_y != 0) {
      uVar2 = output_row_pitch_in_blocks_or_pixels;
      if (output_row_pitch_in_blocks_or_pixels == 0) {
        uVar2 = num_blocks_x;
      }
      uVar5 = 0;
      do {
        if (num_blocks_x != 0) {
          uVar6 = uVar2 * 0x10 * uVar5;
          uVar4 = num_blocks_x;
          do {
            uVar3 = (ulong)uVar6;
            *(undefined2 *)((long)pOutput_blocks + uVar3) = 0x1dff;
            *(undefined4 *)((long)pOutput_blocks + uVar3 + 2) = 0x92244992;
            *(undefined2 *)((long)pOutput_blocks + uVar3 + 6) = 0x2449;
            uVar6 = uVar6 + 0x10;
            uVar4 = uVar4 - 1;
          } while (uVar4 != 0);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != num_blocks_y);
    }
    pOutput_blocks = (void *)((long)pOutput_blocks + 8);
    fmt = cETC1;
    is_alpha_slice = 0;
    uVar2 = 0x10;
    pImage_data_00 = pImage_data;
    uVar5 = rgb_length;
    goto LAB_001297ac;
  case cTFBC1:
    bVar1 = true;
    goto LAB_001296ff;
  case cTFBC3:
    if (uVar2 != 0x10) {
      __assert_fail("bytes_per_block_or_pixel == 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x22ba,
                    "bool basist::basisu_lowlevel_etc1s_transcoder::transcode_image(transcoder_texture_format, void *, uint32_t, const uint8_t *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool, bool, uint32_t, basisu_transcoder_state *, uint32_t)"
                   );
    }
    if (basis_file_has_alpha_slices) {
      bVar1 = transcode_slice(this,pOutput_blocks,num_blocks_x,num_blocks_y,pImage_data_01,
                              alpha_length,cBC4,0x10,false,is_video,true,level_index,orig_width,
                              orig_height,output_row_pitch_in_blocks_or_pixels,pState,false,
                              (void *)0x0,output_rows_in_pixels);
      if (!bVar1) {
        return false;
      }
    }
    else if (num_blocks_y != 0) {
      uVar2 = output_row_pitch_in_blocks_or_pixels;
      if (output_row_pitch_in_blocks_or_pixels == 0) {
        uVar2 = num_blocks_x;
      }
      uVar5 = 0;
      do {
        if (num_blocks_x != 0) {
          uVar6 = uVar2 * 0x10 * uVar5;
          uVar4 = num_blocks_x;
          do {
            uVar3 = (ulong)uVar6;
            *(undefined2 *)((long)pOutput_blocks + uVar3) = 0xffff;
            *(undefined4 *)((long)pOutput_blocks + uVar3 + 2) = 0;
            *(undefined2 *)((long)pOutput_blocks + uVar3 + 6) = 0;
            uVar6 = uVar6 + 0x10;
            uVar4 = uVar4 - 1;
          } while (uVar4 != 0);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != num_blocks_y);
    }
    pOutput_blocks = (void *)((long)pOutput_blocks + 8);
    is_alpha_slice = 0;
    bVar1 = false;
    uVar2 = 0x10;
    pImage_data_00 = pImage_data;
    uVar5 = rgb_length;
LAB_001296ff:
    transcode_alpha = false;
    fmt = cBC1;
    break;
  case cTFBC4:
    goto LAB_00129388;
  case cTFBC5:
    if (uVar2 != 0x10) {
      __assert_fail("bytes_per_block_or_pixel == 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x22e0,
                    "bool basist::basisu_lowlevel_etc1s_transcoder::transcode_image(transcoder_texture_format, void *, uint32_t, const uint8_t *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool, bool, uint32_t, basisu_transcoder_state *, uint32_t)"
                   );
    }
    bVar1 = transcode_slice(this,pOutput_blocks,num_blocks_x,num_blocks_y,pImage_data,rgb_length,
                            cBC4,0x10,false,is_video,false,level_index,orig_width,orig_height,
                            output_row_pitch_in_blocks_or_pixels,pState,false,(void *)0x0,
                            output_rows_in_pixels);
    if (!bVar1) {
      return false;
    }
    if (!basis_file_has_alpha_slices) {
      if (num_blocks_y != 0) {
        if (output_row_pitch_in_blocks_or_pixels == 0) {
          output_row_pitch_in_blocks_or_pixels = num_blocks_x;
        }
        uVar2 = 0;
        do {
          if (num_blocks_x != 0) {
            uVar6 = output_row_pitch_in_blocks_or_pixels * 0x10 * uVar2;
            uVar5 = num_blocks_x;
            do {
              uVar3 = (ulong)uVar6;
              *(undefined2 *)((long)pOutput_blocks + 8 + uVar3) = 0xffff;
              *(undefined4 *)((long)pOutput_blocks + uVar3 + 10) = 0;
              *(undefined2 *)((long)pOutput_blocks + uVar3 + 0xe) = 0;
              uVar6 = uVar6 + 0x10;
              uVar5 = uVar5 - 1;
            } while (uVar5 != 0);
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 != num_blocks_y);
        return true;
      }
      return true;
    }
    is_alpha_slice = 1;
    uVar2 = 0x10;
    pOutput_blocks = (void *)((long)pOutput_blocks + 8);
    pImage_data_00 = pImage_data_01;
    uVar5 = alpha_length;
LAB_00129388:
    transcode_alpha = false;
    bVar1 = false;
    fmt = cBC4;
    break;
  case cTFBC7_M5:
  case cTFBC7_ALT:
    if (uVar2 != 0x10) {
      __assert_fail("bytes_per_block_or_pixel == 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x2275,
                    "bool basist::basisu_lowlevel_etc1s_transcoder::transcode_image(transcoder_texture_format, void *, uint32_t, const uint8_t *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool, bool, uint32_t, basisu_transcoder_state *, uint32_t)"
                   );
    }
    bVar1 = transcode_slice(this,pOutput_blocks,num_blocks_x,num_blocks_y,pImage_data,rgb_length,
                            cBC7_M5_COLOR,0x10,false,is_video,false,level_index,orig_width,
                            orig_height,output_row_pitch_in_blocks_or_pixels,pState,false,
                            (void *)0x0,output_rows_in_pixels);
    if (!basis_file_has_alpha_slices || !bVar1) {
      return bVar1;
    }
    transcode_alpha = false;
    is_alpha_slice = true;
    bVar1 = false;
    uVar2 = 0x10;
    fmt = cBC7_M5_ALPHA;
    pImage_data_00 = pImage_data_01;
    uVar5 = alpha_length;
    break;
  case cTFPVRTC1_4_RGB:
    transcode_alpha = false;
    bVar1 = false;
    fmt = cPVRTC1_4_RGB;
    break;
  case cTFPVRTC1_4_RGBA:
    if (!basis_file_has_alpha_slices) {
      __assert_fail("basis_file_has_alpha_slices",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x2253,
                    "bool basist::basisu_lowlevel_etc1s_transcoder::transcode_image(transcoder_texture_format, void *, uint32_t, const uint8_t *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool, bool, uint32_t, basisu_transcoder_state *, uint32_t)"
                   );
    }
    if (alpha_length == 0) {
      __assert_fail("alpha_length",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x2254,
                    "bool basist::basisu_lowlevel_etc1s_transcoder::transcode_image(transcoder_texture_format, void *, uint32_t, const uint8_t *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool, bool, uint32_t, basisu_transcoder_state *, uint32_t)"
                   );
    }
    basisu::vector<unsigned_int>::vector(&temp_block_indices,(ulong)(num_blocks_y * num_blocks_x));
    if (temp_block_indices.m_size == 0) {
LAB_00129987:
      __assert_fail("i < m_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                    ,0x178,"T &basisu::vector<unsigned int>::operator[](size_t) [T = unsigned int]")
      ;
    }
    bVar1 = transcode_slice(this,temp_block_indices.m_p,num_blocks_x,num_blocks_y,pImage_data_01,
                            alpha_length,cIndices,4,false,is_video,true,level_index,orig_width,
                            orig_height,num_blocks_x,pState,false,(void *)0x0,0);
    if (bVar1) {
      if (temp_block_indices.m_size == 0) goto LAB_00129987;
      bVar1 = transcode_slice(this,pOutput_blocks,num_blocks_x,num_blocks_y,pImage_data,rgb_length,
                              cPVRTC1_4_RGBA,uVar2,false,is_video,false,level_index,orig_width,
                              orig_height,output_row_pitch_in_blocks_or_pixels,pState,false,
                              temp_block_indices.m_p,0);
    }
    else {
      bVar1 = false;
    }
    if (temp_block_indices.m_p != (uint *)0x0) {
      free(temp_block_indices.m_p);
      return bVar1;
    }
    return bVar1;
  case cTFASTC_4x4:
    if (uVar2 != 0x10) {
      __assert_fail("bytes_per_block_or_pixel == 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x2308,
                    "bool basist::basisu_lowlevel_etc1s_transcoder::transcode_image(transcoder_texture_format, void *, uint32_t, const uint8_t *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool, bool, uint32_t, basisu_transcoder_state *, uint32_t)"
                   );
    }
    if (basis_file_has_alpha_slices) {
      bVar1 = transcode_slice(this,pOutput_blocks,num_blocks_x,num_blocks_y,pImage_data_01,
                              alpha_length,cIndices,0x10,false,is_video,true,level_index,orig_width,
                              orig_height,output_row_pitch_in_blocks_or_pixels,pState,false,
                              (void *)0x0,output_rows_in_pixels);
      if (!bVar1) {
        return false;
      }
      transcode_alpha = true;
    }
    else {
      transcode_alpha = false;
    }
    is_alpha_slice = false;
    bVar1 = false;
    uVar2 = 0x10;
    fmt = cASTC_4x4;
    pImage_data_00 = pImage_data;
    uVar5 = rgb_length;
    break;
  case cTFATC_RGB:
    goto LAB_00129608;
  case cTFATC_RGBA:
    if (uVar2 != 0x10) {
      __assert_fail("bytes_per_block_or_pixel == 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x233b,
                    "bool basist::basisu_lowlevel_etc1s_transcoder::transcode_image(transcoder_texture_format, void *, uint32_t, const uint8_t *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool, bool, uint32_t, basisu_transcoder_state *, uint32_t)"
                   );
    }
    if (basis_file_has_alpha_slices) {
      bVar1 = transcode_slice(this,pOutput_blocks,num_blocks_x,num_blocks_y,pImage_data_01,
                              alpha_length,cBC4,0x10,false,is_video,true,level_index,orig_width,
                              orig_height,output_row_pitch_in_blocks_or_pixels,pState,false,
                              (void *)0x0,output_rows_in_pixels);
      if (!bVar1) {
        return false;
      }
    }
    else if (num_blocks_y != 0) {
      uVar2 = output_row_pitch_in_blocks_or_pixels;
      if (output_row_pitch_in_blocks_or_pixels == 0) {
        uVar2 = num_blocks_x;
      }
      uVar5 = 0;
      do {
        if (num_blocks_x != 0) {
          uVar6 = uVar2 * 0x10 * uVar5;
          uVar4 = num_blocks_x;
          do {
            uVar3 = (ulong)uVar6;
            *(undefined2 *)((long)pOutput_blocks + uVar3) = 0xffff;
            *(undefined4 *)((long)pOutput_blocks + uVar3 + 2) = 0;
            *(undefined2 *)((long)pOutput_blocks + uVar3 + 6) = 0;
            uVar6 = uVar6 + 0x10;
            uVar4 = uVar4 - 1;
          } while (uVar4 != 0);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != num_blocks_y);
    }
    pOutput_blocks = (void *)((long)pOutput_blocks + 8);
    is_alpha_slice = 0;
    uVar2 = 0x10;
    pImage_data_00 = pImage_data;
    uVar5 = rgb_length;
LAB_00129608:
    transcode_alpha = false;
    bVar1 = false;
    fmt = cATC_RGB;
    break;
  case cTFRGBA32:
    fmt = cRGBA32;
    if (basis_file_has_alpha_slices) {
      bVar1 = transcode_slice(this,pOutput_blocks,num_blocks_x,num_blocks_y,pImage_data_01,
                              alpha_length,cA32,4,false,is_video,true,level_index,orig_width,
                              orig_height,output_row_pitch_in_blocks_or_pixels,pState,false,
                              (void *)0x0,output_rows_in_pixels);
      fmt = cRGB32;
      if (!bVar1) {
        return false;
      }
    }
    uVar2 = 4;
    goto LAB_00129090;
  case cTFRGB565:
  case cTFBGR565:
    fmt = fmt_00 == cTFRGB565 ^ cBGR565;
    uVar2 = 2;
LAB_001297ac:
    transcode_alpha = false;
    bVar1 = false;
    break;
  case cTFRGBA4444:
    fmt = cRGBA4444_COLOR_OPAQUE;
    if (basis_file_has_alpha_slices) {
      bVar1 = transcode_slice(this,pOutput_blocks,num_blocks_x,num_blocks_y,pImage_data_01,
                              alpha_length,cRGBA4444_ALPHA,2,false,is_video,true,level_index,
                              orig_width,orig_height,output_row_pitch_in_blocks_or_pixels,pState,
                              false,(void *)0x0,output_rows_in_pixels);
      fmt = cRGBA4444_COLOR;
      if (!bVar1) {
        return false;
      }
    }
    uVar2 = 2;
LAB_00129090:
    transcode_alpha = false;
    is_alpha_slice = false;
    bVar1 = false;
    pImage_data_00 = pImage_data;
    uVar5 = rgb_length;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x2415,
                  "bool basist::basisu_lowlevel_etc1s_transcoder::transcode_image(transcoder_texture_format, void *, uint32_t, const uint8_t *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool, bool, uint32_t, basisu_transcoder_state *, uint32_t)"
                 );
  case cTFPVRTC2_4_RGB:
    goto LAB_001294ac;
  case cTFPVRTC2_4_RGBA:
    if (basis_file_has_alpha_slices) {
      bVar1 = transcode_slice(this,pOutput_blocks,num_blocks_x,num_blocks_y,pImage_data_01,
                              alpha_length,cIndices,uVar2,false,is_video,true,level_index,orig_width
                              ,orig_height,output_row_pitch_in_blocks_or_pixels,pState,false,
                              (void *)0x0,output_rows_in_pixels);
      if (!bVar1) {
        return false;
      }
      transcode_alpha = true;
      is_alpha_slice = false;
      bVar1 = false;
      fmt = cPVRTC2_4_RGBA;
      pImage_data_00 = pImage_data;
      uVar5 = rgb_length;
      break;
    }
    is_alpha_slice = 0;
    pImage_data_00 = pImage_data;
    uVar5 = rgb_length;
LAB_001294ac:
    transcode_alpha = false;
    bVar1 = false;
    fmt = cPVRTC2_4_RGB;
    break;
  case cTFETC2_EAC_R11:
    goto LAB_0012955b;
  case cTFETC2_EAC_RG11:
    if (uVar2 != 0x10) {
      __assert_fail("bytes_per_block_or_pixel == 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x23f3,
                    "bool basist::basisu_lowlevel_etc1s_transcoder::transcode_image(transcoder_texture_format, void *, uint32_t, const uint8_t *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool, bool, uint32_t, basisu_transcoder_state *, uint32_t)"
                   );
    }
    if (basis_file_has_alpha_slices) {
      bVar1 = transcode_slice(this,(void *)((long)pOutput_blocks + 8),num_blocks_x,num_blocks_y,
                              pImage_data_01,alpha_length,cETC2_EAC_R11,0x10,false,is_video,true,
                              level_index,orig_width,orig_height,
                              output_row_pitch_in_blocks_or_pixels,pState,false,(void *)0x0,
                              output_rows_in_pixels);
      if (!bVar1) {
        return false;
      }
    }
    else if (num_blocks_y != 0) {
      uVar2 = output_row_pitch_in_blocks_or_pixels;
      if (output_row_pitch_in_blocks_or_pixels == 0) {
        uVar2 = num_blocks_x;
      }
      uVar5 = 0;
      do {
        if (num_blocks_x != 0) {
          uVar6 = uVar2 * 0x10 * uVar5;
          uVar4 = num_blocks_x;
          do {
            uVar3 = (ulong)uVar6;
            *(undefined2 *)((long)pOutput_blocks + 8 + uVar3) = 0x1dff;
            *(undefined4 *)((long)pOutput_blocks + uVar3 + 10) = 0x92244992;
            *(undefined2 *)((long)pOutput_blocks + uVar3 + 0xe) = 0x2449;
            uVar6 = uVar6 + 0x10;
            uVar4 = uVar4 - 1;
          } while (uVar4 != 0);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != num_blocks_y);
    }
    is_alpha_slice = 0;
    uVar2 = 0x10;
    pImage_data_00 = pImage_data;
    uVar5 = rgb_length;
LAB_0012955b:
    transcode_alpha = false;
    bVar1 = false;
    fmt = cETC2_EAC_R11;
  }
  bVar1 = transcode_slice(this,pOutput_blocks,num_blocks_x,num_blocks_y,pImage_data_00,uVar5,fmt,
                          uVar2,bVar1,is_video,(bool)is_alpha_slice,level_index,orig_width,
                          orig_height,output_row_pitch_in_blocks_or_pixels,pState,transcode_alpha,
                          (void *)0x0,output_rows_in_pixels);
  return bVar1;
}

Assistant:

bool basisu_lowlevel_etc1s_transcoder::transcode_image(
			transcoder_texture_format target_format,
			void* pOutput_blocks, uint32_t output_blocks_buf_size_in_blocks_or_pixels,
			const uint8_t* pCompressed_data, uint32_t compressed_data_length,
			uint32_t num_blocks_x, uint32_t num_blocks_y, uint32_t orig_width, uint32_t orig_height, uint32_t level_index,
			uint32_t rgb_offset, uint32_t rgb_length, uint32_t alpha_offset, uint32_t alpha_length,
			uint32_t decode_flags,
			bool basis_file_has_alpha_slices,
			bool is_video,
			uint32_t output_row_pitch_in_blocks_or_pixels,
			basisu_transcoder_state* pState,
			uint32_t output_rows_in_pixels)
	{
		if (((uint64_t)rgb_offset + rgb_length) > (uint64_t)compressed_data_length)
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: source data buffer too small (color)\n");
			return false;
		}

		if (alpha_length)
		{
			if (((uint64_t)alpha_offset + alpha_length) > (uint64_t)compressed_data_length)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: source data buffer too small (alpha)\n");
				return false;
			}
		}
		else
		{
			assert(!basis_file_has_alpha_slices);
		}

		if ((target_format == transcoder_texture_format::cTFPVRTC1_4_RGB) || (target_format == transcoder_texture_format::cTFPVRTC1_4_RGBA))
		{
			if ((!basisu::is_pow2(num_blocks_x * 4)) || (!basisu::is_pow2(num_blocks_y * 4)))
			{
				// PVRTC1 only supports power of 2 dimensions
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: PVRTC1 only supports power of 2 dimensions\n");
				return false;
			}
		}

		if ((target_format == transcoder_texture_format::cTFPVRTC1_4_RGBA) && (!basis_file_has_alpha_slices))
		{
			// Switch to PVRTC1 RGB if the input doesn't have alpha.
			target_format = transcoder_texture_format::cTFPVRTC1_4_RGB;
		}
				
		const bool transcode_alpha_data_to_opaque_formats = (decode_flags & cDecodeFlagsTranscodeAlphaDataToOpaqueFormats) != 0;
		const uint32_t bytes_per_block_or_pixel = basis_get_bytes_per_block_or_pixel(target_format);
		const uint32_t total_slice_blocks = num_blocks_x * num_blocks_y;

		if (!basis_validate_output_buffer_size(target_format, output_blocks_buf_size_in_blocks_or_pixels, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, output_rows_in_pixels, total_slice_blocks))
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: output buffer size too small\n");
			return false;
		}

		bool status = false;

		const uint8_t* pData = pCompressed_data + rgb_offset;
		uint32_t data_len = rgb_length;
		bool is_alpha_slice = false;

		// If the caller wants us to transcode the mip level's alpha data, then use the next slice.
		if ((basis_file_has_alpha_slices) && (transcode_alpha_data_to_opaque_formats))
		{
			pData = pCompressed_data + alpha_offset;
			data_len = alpha_length;
			is_alpha_slice = true;
		}

		switch (target_format)
		{
		case transcoder_texture_format::cTFETC1_RGB:
		{
			//status = transcode_slice(pData, data_size, slice_index_to_decode, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cETC1, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pData, data_len, block_format::cETC1, bytes_per_block_or_pixel, false, is_video, is_alpha_slice, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
							
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to ETC1 failed\n");
			}
			break;
		}
		case transcoder_texture_format::cTFBC1_RGB:
		{
#if !BASISD_SUPPORT_DXT1
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: BC1/DXT1 unsupported\n");
			return false;
#else
			// status = transcode_slice(pData, data_size, slice_index_to_decode, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cBC1, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pData, data_len, block_format::cBC1, bytes_per_block_or_pixel, true, is_video, is_alpha_slice, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to BC1 failed\n");
			}
			break;
#endif
		}
		case transcoder_texture_format::cTFBC4_R:
		{
#if !BASISD_SUPPORT_DXT5A
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: BC4/DXT5A unsupported\n");
			return false;
#else
			//status = transcode_slice(pData, data_size, slice_index_to_decode, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cBC4, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pData, data_len, block_format::cBC4, bytes_per_block_or_pixel, false, is_video, is_alpha_slice, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to BC4 failed\n");
			}
			break;
#endif
		}
		case transcoder_texture_format::cTFPVRTC1_4_RGB:
		{
#if !BASISD_SUPPORT_PVRTC1
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: PVRTC1 4 unsupported\n");
			return false;
#else
			// output_row_pitch_in_blocks_or_pixels is actually ignored because we're transcoding to PVRTC1. (Print a dev warning if it's != 0?)
			//status = transcode_slice(pData, data_size, slice_index_to_decode, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cPVRTC1_4_RGB, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pData, data_len, block_format::cPVRTC1_4_RGB, bytes_per_block_or_pixel, false, is_video, is_alpha_slice, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to PVRTC1 4 RGB failed\n");
			}
			break;
#endif
		}
		case transcoder_texture_format::cTFPVRTC1_4_RGBA:
		{
#if !BASISD_SUPPORT_PVRTC1
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: PVRTC1 4 unsupported\n");
			return false;
#else
			assert(basis_file_has_alpha_slices);
			assert(alpha_length);

			// Temp buffer to hold alpha block endpoint/selector indices
			basisu::vector<uint32_t> temp_block_indices(total_slice_blocks);

			// First transcode alpha data to temp buffer
			//status = transcode_slice(pData, data_size, slice_index + 1, &temp_block_indices[0], total_slice_blocks, block_format::cIndices, sizeof(uint32_t), decode_flags, pSlice_descs[slice_index].m_num_blocks_x, pState);
			status = transcode_slice(&temp_block_indices[0], num_blocks_x, num_blocks_y, pCompressed_data + alpha_offset, alpha_length, block_format::cIndices, sizeof(uint32_t), false, is_video, true, level_index, orig_width, orig_height, num_blocks_x, pState, false, nullptr, 0);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to PVRTC1 4 RGBA failed (0)\n");
			}
			else
			{
				// output_row_pitch_in_blocks_or_pixels is actually ignored because we're transcoding to PVRTC1. (Print a dev warning if it's != 0?)
				//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cPVRTC1_4_RGBA, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState, &temp_block_indices[0]);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + rgb_offset, rgb_length, block_format::cPVRTC1_4_RGBA, bytes_per_block_or_pixel, false, is_video, false, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, &temp_block_indices[0], 0);
				if (!status)
				{
					BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to PVRTC1 4 RGBA failed (1)\n");
				}
			}

			break;
#endif
		}
		case transcoder_texture_format::cTFBC7_RGBA:
		case transcoder_texture_format::cTFBC7_ALT:
		{
#if !BASISD_SUPPORT_BC7_MODE5
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: BC7 unsupported\n");
			return false;
#else
			assert(bytes_per_block_or_pixel == 16);
			// We used to support transcoding just alpha to BC7 - but is that useful at all?

			// First transcode the color slice. The cBC7_M5_COLOR transcoder will output opaque mode 5 blocks.
			//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cBC7_M5_COLOR, 16, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + rgb_offset, rgb_length, block_format::cBC7_M5_COLOR, bytes_per_block_or_pixel, false, is_video, false, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);

			if ((status) && (basis_file_has_alpha_slices))
			{
				// Now transcode the alpha slice. The cBC7_M5_ALPHA transcoder will now change the opaque mode 5 blocks to blocks with alpha.
				//status = transcode_slice(pData, data_size, slice_index + 1, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cBC7_M5_ALPHA, 16, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + alpha_offset, alpha_length, block_format::cBC7_M5_ALPHA, bytes_per_block_or_pixel, false, is_video, true, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			}

			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to BC7 failed (0)\n");
			}

			break;
#endif
		}
		case transcoder_texture_format::cTFETC2_RGBA:
		{
#if !BASISD_SUPPORT_ETC2_EAC_A8
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: ETC2 EAC A8 unsupported\n");
			return false;
#else
			assert(bytes_per_block_or_pixel == 16);

			if (basis_file_has_alpha_slices)
			{
				// First decode the alpha data 
				//status = transcode_slice(pData, data_size, slice_index + 1, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cETC2_EAC_A8, 16, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + alpha_offset, alpha_length, block_format::cETC2_EAC_A8, bytes_per_block_or_pixel, false, is_video, true, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			}
			else
			{
				//write_opaque_alpha_blocks(pSlice_descs[slice_index].m_num_blocks_x, pSlice_descs[slice_index].m_num_blocks_y, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cETC2_EAC_A8, 16, output_row_pitch_in_blocks_or_pixels);
				basisu_transcoder::write_opaque_alpha_blocks(num_blocks_x, num_blocks_y, pOutput_blocks, block_format::cETC2_EAC_A8, 16, output_row_pitch_in_blocks_or_pixels);
				status = true;
			}

			if (status)
			{
				// Now decode the color data
				//status = transcode_slice(pData, data_size, slice_index, (uint8_t*)pOutput_blocks + 8, output_blocks_buf_size_in_blocks_or_pixels, block_format::cETC1, 16, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
				status = transcode_slice((uint8_t *)pOutput_blocks + 8, num_blocks_x, num_blocks_y, pCompressed_data + rgb_offset, rgb_length, block_format::cETC1, bytes_per_block_or_pixel, false, is_video, false, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
				if (!status)
				{
					BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to ETC2 RGB failed\n");
				}
			}
			else
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to ETC2 A failed\n");
			}
			break;
#endif
		}
		case transcoder_texture_format::cTFBC3_RGBA:
		{
#if !BASISD_SUPPORT_DXT1
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: DXT1 unsupported\n");
			return false;
#elif !BASISD_SUPPORT_DXT5A
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: DXT5A unsupported\n");
			return false;
#else
			assert(bytes_per_block_or_pixel == 16);
						
			// First decode the alpha data 
			if (basis_file_has_alpha_slices)
			{
				//status = transcode_slice(pData, data_size, slice_index + 1, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cBC4, 16, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + alpha_offset, alpha_length, block_format::cBC4, bytes_per_block_or_pixel, false, is_video, true, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			}
			else
			{
				basisu_transcoder::write_opaque_alpha_blocks(num_blocks_x, num_blocks_y, pOutput_blocks, block_format::cBC4, 16, output_row_pitch_in_blocks_or_pixels);
				status = true;
			}

			if (status)
			{
				// Now decode the color data. Forbid 3 color blocks, which aren't allowed in BC3.
				//status = transcode_slice(pData, data_size, slice_index, (uint8_t*)pOutput_blocks + 8, output_blocks_buf_size_in_blocks_or_pixels, block_format::cBC1, 16, decode_flags | cDecodeFlagsBC1ForbidThreeColorBlocks, output_row_pitch_in_blocks_or_pixels, pState);
				status = transcode_slice((uint8_t *)pOutput_blocks + 8, num_blocks_x, num_blocks_y, pCompressed_data + rgb_offset, rgb_length, block_format::cBC1, bytes_per_block_or_pixel, false, is_video, false, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
				if (!status)
				{
					BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to BC3 RGB failed\n");
				}
			}
			else
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to BC3 A failed\n");
			}

			break;
#endif
		}
		case transcoder_texture_format::cTFBC5_RG:
		{
#if !BASISD_SUPPORT_DXT5A
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: DXT5A unsupported\n");
			return false;
#else
			assert(bytes_per_block_or_pixel == 16);

			//bool transcode_slice(void* pDst_blocks, uint32_t num_blocks_x, uint32_t num_blocks_y, const uint8_t* pImage_data, uint32_t image_data_size, block_format fmt,
				//	uint32_t output_block_or_pixel_stride_in_bytes, bool bc1_allow_threecolor_blocks, const bool is_video, const bool is_alpha_slice, const uint32_t level_index, const uint32_t orig_width, const uint32_t orig_height, uint32_t output_row_pitch_in_blocks_or_pixels = 0,
				//	basisu_transcoder_state* pState = nullptr, bool astc_transcode_alpha = false, void* pAlpha_blocks = nullptr, uint32_t output_rows_in_pixels = 0);

			// Decode the R data (actually the green channel of the color data slice in the basis file)
			//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cBC4, 16, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + rgb_offset, rgb_length, block_format::cBC4, bytes_per_block_or_pixel, false, is_video, false, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			if (status)
			{
				if (basis_file_has_alpha_slices)
				{
					// Decode the G data (actually the green channel of the alpha data slice in the basis file)
					//status = transcode_slice(pData, data_size, slice_index + 1, (uint8_t*)pOutput_blocks + 8, output_blocks_buf_size_in_blocks_or_pixels, block_format::cBC4, 16, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
					status = transcode_slice((uint8_t *)pOutput_blocks + 8, num_blocks_x, num_blocks_y, pCompressed_data + alpha_offset, alpha_length, block_format::cBC4, bytes_per_block_or_pixel, false, is_video, true, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
					if (!status)
					{
						BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to BC5 1 failed\n");
					}
				}
				else
				{
					basisu_transcoder::write_opaque_alpha_blocks(num_blocks_x, num_blocks_y, (uint8_t*)pOutput_blocks + 8, block_format::cBC4, 16, output_row_pitch_in_blocks_or_pixels);
					status = true;
				}
			}
			else
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to BC5 channel 0 failed\n");
			}
			break;
#endif
		}
		case transcoder_texture_format::cTFASTC_4x4_RGBA:
		{
#if !BASISD_SUPPORT_ASTC
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: ASTC unsupported\n");
			return false;
#else
			assert(bytes_per_block_or_pixel == 16);

			if (basis_file_has_alpha_slices)
			{
				// First decode the alpha data to the output (we're using the output texture as a temp buffer here).
				//status = transcode_slice(pData, data_size, slice_index + 1, (uint8_t*)pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cIndices, 16, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + alpha_offset, alpha_length, block_format::cIndices, bytes_per_block_or_pixel, false, is_video, true, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
				if (status)
				{
					// Now decode the color data and transcode to ASTC. The transcoder function will read the alpha selector data from the output texture as it converts and
					// transcode both the alpha and color data at the same time to ASTC.
					//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cASTC_4x4, 16, decode_flags | cDecodeFlagsOutputHasAlphaIndices, output_row_pitch_in_blocks_or_pixels, pState);
					status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + rgb_offset, rgb_length, block_format::cASTC_4x4, bytes_per_block_or_pixel, false, is_video, false, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, true, nullptr, output_rows_in_pixels);
				}
			}
			else
				//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cASTC_4x4, 16, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + rgb_offset, rgb_length, block_format::cASTC_4x4, bytes_per_block_or_pixel, false, is_video, false, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);

			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to ASTC failed (0)\n");
			}

			break;
#endif
		}
		case transcoder_texture_format::cTFATC_RGB:
		{
#if !BASISD_SUPPORT_ATC
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: ATC unsupported\n");
			return false;
#else
			//status = transcode_slice(pData, data_size, slice_index_to_decode, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cATC_RGB, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pData, data_len, block_format::cATC_RGB, bytes_per_block_or_pixel, false, is_video, is_alpha_slice, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to ATC_RGB failed\n");
			}
			break;
#endif
		}
		case transcoder_texture_format::cTFATC_RGBA:
		{
#if !BASISD_SUPPORT_ATC
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: ATC unsupported\n");
			return false;
#elif !BASISD_SUPPORT_DXT5A
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: DXT5A unsupported\n");
			return false;
#else
			assert(bytes_per_block_or_pixel == 16);

			// First decode the alpha data 
			if (basis_file_has_alpha_slices)
			{
				//status = transcode_slice(pData, data_size, slice_index + 1, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cBC4, 16, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + alpha_offset, alpha_length, block_format::cBC4, bytes_per_block_or_pixel, false, is_video, true, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			}
			else
			{
				basisu_transcoder::write_opaque_alpha_blocks(num_blocks_x, num_blocks_y, pOutput_blocks, block_format::cBC4, 16, output_row_pitch_in_blocks_or_pixels);
				status = true;
			}

			if (status)
			{
				//status = transcode_slice(pData, data_size, slice_index, (uint8_t*)pOutput_blocks + 8, output_blocks_buf_size_in_blocks_or_pixels, block_format::cATC_RGB, 16, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
				status = transcode_slice((uint8_t *)pOutput_blocks + 8, num_blocks_x, num_blocks_y, pCompressed_data + rgb_offset, rgb_length, block_format::cATC_RGB, bytes_per_block_or_pixel, false, is_video, false, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
				if (!status)
				{
					BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to ATC RGB failed\n");
				}
			}
			else
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to ATC A failed\n");
			}
			break;
#endif
		}
		case transcoder_texture_format::cTFPVRTC2_4_RGB:
		{
#if !BASISD_SUPPORT_PVRTC2
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: PVRTC2 unsupported\n");
			return false;
#else
			//status = transcode_slice(pData, data_size, slice_index_to_decode, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cPVRTC2_4_RGB, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pData, data_len, block_format::cPVRTC2_4_RGB, bytes_per_block_or_pixel, false, is_video, is_alpha_slice, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to cPVRTC2_4_RGB failed\n");
			}
			break;
#endif
		}
		case transcoder_texture_format::cTFPVRTC2_4_RGBA:
		{
#if !BASISD_SUPPORT_PVRTC2
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: PVRTC2 unsupported\n");
			return false;
#else
			if (basis_file_has_alpha_slices)
			{
				// First decode the alpha data to the output (we're using the output texture as a temp buffer here).
				//status = transcode_slice(pData, data_size, slice_index + 1, (uint8_t*)pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cIndices, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + alpha_offset, alpha_length, block_format::cIndices, bytes_per_block_or_pixel, false, is_video, true, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
				if (!status)
				{
					BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to failed\n");
				}
				else
				{
					// Now decode the color data and transcode to PVRTC2 RGBA. 
					//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cPVRTC2_4_RGBA, bytes_per_block_or_pixel, decode_flags | cDecodeFlagsOutputHasAlphaIndices, output_row_pitch_in_blocks_or_pixels, pState);
					status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + rgb_offset, rgb_length, block_format::cPVRTC2_4_RGBA, bytes_per_block_or_pixel, false, is_video, false, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, true, nullptr, output_rows_in_pixels);
				}
			}
			else
				//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cPVRTC2_4_RGB, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + rgb_offset, rgb_length, block_format::cPVRTC2_4_RGB, bytes_per_block_or_pixel, false, is_video, false, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);

			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to cPVRTC2_4_RGBA failed\n");
			}

			break;
#endif
		}
		case transcoder_texture_format::cTFRGBA32:
		{
			// Raw 32bpp pixels, decoded in the usual raster order (NOT block order) into an image in memory.

			// First decode the alpha data 
			if (basis_file_has_alpha_slices)
				//status = transcode_slice(pData, data_size, slice_index + 1, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cA32, sizeof(uint32_t), decode_flags, output_row_pitch_in_blocks_or_pixels, pState, nullptr, output_rows_in_pixels);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + alpha_offset, alpha_length, block_format::cA32, sizeof(uint32_t), false, is_video, true, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			else
				status = true;

			if (status)
			{
				//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, basis_file_has_alpha_slices ? block_format::cRGB32 : block_format::cRGBA32, sizeof(uint32_t), decode_flags, output_row_pitch_in_blocks_or_pixels, pState, nullptr, output_rows_in_pixels);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + rgb_offset, rgb_length, basis_file_has_alpha_slices ? block_format::cRGB32 : block_format::cRGBA32, sizeof(uint32_t), false, is_video, false, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
				if (!status)
				{
					BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to RGBA32 RGB failed\n");
				}
			}
			else
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to RGBA32 A failed\n");
			}

			break;
		}
		case transcoder_texture_format::cTFRGB565:
		case transcoder_texture_format::cTFBGR565:
		{
			// Raw 16bpp pixels, decoded in the usual raster order (NOT block order) into an image in memory.

			//status = transcode_slice(pData, data_size, slice_index_to_decode, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, (fmt == transcoder_texture_format::cTFRGB565) ? block_format::cRGB565 : block_format::cBGR565, sizeof(uint16_t), decode_flags, output_row_pitch_in_blocks_or_pixels, pState, nullptr, output_rows_in_pixels);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pData, data_len, (target_format == transcoder_texture_format::cTFRGB565) ? block_format::cRGB565 : block_format::cBGR565, sizeof(uint16_t), false, is_video, is_alpha_slice, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to RGB565 RGB failed\n");
			}

			break;
		}
		case transcoder_texture_format::cTFRGBA4444:
		{
			// Raw 16bpp pixels, decoded in the usual raster order (NOT block order) into an image in memory.

			// First decode the alpha data 
			if (basis_file_has_alpha_slices)
				//status = transcode_slice(pData, data_size, slice_index + 1, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cRGBA4444_ALPHA, sizeof(uint16_t), decode_flags, output_row_pitch_in_blocks_or_pixels, pState, nullptr, output_rows_in_pixels);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + alpha_offset, alpha_length, block_format::cRGBA4444_ALPHA, sizeof(uint16_t), false, is_video, true, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			else
				status = true;

			if (status)
			{
				//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, basis_file_has_alpha_slices ? block_format::cRGBA4444_COLOR : block_format::cRGBA4444_COLOR_OPAQUE, sizeof(uint16_t), decode_flags, output_row_pitch_in_blocks_or_pixels, pState, nullptr, output_rows_in_pixels);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + rgb_offset, rgb_length, basis_file_has_alpha_slices ? block_format::cRGBA4444_COLOR : block_format::cRGBA4444_COLOR_OPAQUE, sizeof(uint16_t), false, is_video, false, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
				if (!status)
				{
					BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to RGBA4444 RGB failed\n");
				}
			}
			else
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to RGBA4444 A failed\n");
			}

			break;
		}
		case transcoder_texture_format::cTFFXT1_RGB:
		{
#if !BASISD_SUPPORT_FXT1
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: FXT1 unsupported\n");
			return false;
#else
			//status = transcode_slice(pData, data_size, slice_index_to_decode, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cFXT1_RGB, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pData, data_len, block_format::cFXT1_RGB, bytes_per_block_or_pixel, false, is_video, is_alpha_slice, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to FXT1_RGB failed\n");
			}
			break;
#endif
		}
		case transcoder_texture_format::cTFETC2_EAC_R11:
		{
#if !BASISD_SUPPORT_ETC2_EAC_RG11
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: EAC_RG11 unsupported\n");
			return false;
#else
			//status = transcode_slice(pData, data_size, slice_index_to_decode, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cETC2_EAC_R11, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pData, data_len, block_format::cETC2_EAC_R11, bytes_per_block_or_pixel, false, is_video, is_alpha_slice, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to ETC2_EAC_R11 failed\n");
			}

			break;
#endif
		}
		case transcoder_texture_format::cTFETC2_EAC_RG11:
		{
#if !BASISD_SUPPORT_ETC2_EAC_RG11
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: EAC_RG11 unsupported\n");
			return false;
#else
			assert(bytes_per_block_or_pixel == 16);

			if (basis_file_has_alpha_slices)
			{
				// First decode the alpha data to G
				//status = transcode_slice(pData, data_size, slice_index + 1, (uint8_t*)pOutput_blocks + 8, output_blocks_buf_size_in_blocks_or_pixels, block_format::cETC2_EAC_R11, 16, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
				status = transcode_slice((uint8_t *)pOutput_blocks + 8, num_blocks_x, num_blocks_y, pCompressed_data + alpha_offset, alpha_length, block_format::cETC2_EAC_R11, bytes_per_block_or_pixel, false, is_video, true, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			}
			else
			{
				basisu_transcoder::write_opaque_alpha_blocks(num_blocks_x, num_blocks_y, (uint8_t*)pOutput_blocks + 8, block_format::cETC2_EAC_R11, 16, output_row_pitch_in_blocks_or_pixels);
				status = true;
			}

			if (status)
			{
				// Now decode the color data to R
				//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cETC2_EAC_R11, 16, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + rgb_offset, rgb_length, block_format::cETC2_EAC_R11, bytes_per_block_or_pixel, false, is_video, false, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
				if (!status)
				{
					BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to ETC2_EAC_R11 R failed\n");
				}
			}
			else
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to ETC2_EAC_R11 G failed\n");
			}

			break;
#endif
		}
		default:
		{
			assert(0);
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: Invalid fmt\n");
			break;
		}
		}

		return status;
	}